

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int fits_set_dither_offset(fitsfile *fptr,int offset,int *status)

{
  if (offset < 0x2711) {
    fptr->Fptr->request_dither_seed = offset;
  }
  else {
    ffpmsg("illegal dithering seed value (fits_set_dither_seed)");
    *status = 0x19d;
  }
  return *status;
}

Assistant:

int fits_set_dither_offset(fitsfile *fptr,  /* I - FITS file pointer   */
           int offset,        /* random dithering offset value (1 to 10000) */
           int *status)         /* IO - error status                */
{
/*
    The name of this routine has changed.  This is kept just for
    backwards compatibility with any software that calls the old name
*/

    fits_set_dither_seed(fptr, offset, status);
    return(*status);
}